

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chipset.cpp
# Opt level: O3

bool __thiscall Amiga::Chipset::perform_cycle<131,true>(Chipset *this)

{
  bool bVar1;
  HorizontalFetch HVar2;
  
  if (this->fetch_window_[0] == 0x83) {
    this->horizontal_offset_ = 0x83;
    this->horizontal_fetch_ = Started;
  }
  if (this->fetch_window_[1] == 0x83) {
    this->horizontal_fetch_ = WillRequestStop;
    HVar2 = WillRequestStop;
  }
  else {
    HVar2 = this->horizontal_fetch_;
    if (HVar2 == Stopped) goto LAB_00253351;
  }
  if ((3U - this->horizontal_offset_ & 7) == 0) {
    if (HVar2 == StopRequested) {
      this->horizontal_fetch_ = Stopped;
      goto LAB_00253351;
    }
    if (HVar2 == WillRequestStop) {
      this->horizontal_fetch_ = StopRequested;
    }
  }
  if ((((~*(uint *)&this->dma_control_ & 0x300) == 0) && (this->fetch_vertical_ == true)) &&
     (bVar1 = Bitplanes::advance_dma(&this->bitplanes_,0x83 - this->horizontal_offset_), bVar1)) {
    this->did_fetch_ = true;
    return false;
  }
LAB_00253351:
  bVar1 = true;
  if ((~*(uint *)&this->dma_control_ & 0x240) == 0) {
    bVar1 = Blitter<false>::advance_dma<true>(&this->blitter_);
    bVar1 = !bVar1;
  }
  return bVar1;
}

Assistant:

bool Chipset::perform_cycle() {

	// Update state as to whether bitplane fetching should happen now.
	//
	// TODO: figure out how the hard stops factor into this.
	//

	// Top priority: bitplane collection.
	if(cycle == fetch_window_[0]) {
		horizontal_fetch_ = HorizontalFetch::Started;
		horizontal_offset_ = cycle;
	}
	if(cycle == fetch_window_[1]) {
		horizontal_fetch_ = HorizontalFetch::WillRequestStop;
	}
	if(horizontal_fetch_ != HorizontalFetch::Stopped) {
		if(!((cycle - horizontal_offset_) & 7)) {
			switch(horizontal_fetch_) {
				case HorizontalFetch::WillRequestStop: horizontal_fetch_ = HorizontalFetch::StopRequested; break;
				case HorizontalFetch::StopRequested: horizontal_fetch_ = HorizontalFetch::Stopped; break;
				default: break;
			}
		}

		constexpr auto BitplaneEnabled = DMAFlag::AllBelow | DMAFlag::Bitplane;
		if(
			horizontal_fetch_ != HorizontalFetch::Stopped &&
			(dma_control_ & BitplaneEnabled) == BitplaneEnabled &&
			fetch_vertical_ &&
			bitplanes_.advance_dma(cycle - horizontal_offset_)
		) {
			did_fetch_ = true;
			return false;
		}
	}

	// Contradictory snippets from the Hardware Reference manual:
	//
	// 1)
	// The Copper is a two-cycle processor that requests the bus only during
	// odd-numbered memory cycles. This prevents collision with audio, disk,
	// refresh, sprites, and most low resolution display DMA access, all of which
	// use only the even-numbered memory cycles.
	//
	// 2)
	//  |<- - - - - - - - average 68000 cycle - - - - - - - - ->|
	//  |                                                       |
	//  |<- - - - internal  - - - ->|<- - - - - memory  - - - ->|
	//  |         operation         |           access          |
	//  |         portion           |           portion         |
	//  |                           |                           |
	//  |        odd cycle,         |         even cycle,       |
	//  |        assigned to        |         available to      |
	//  |        other devices      |         the 68000         |
	//
	//				Figure 6-10: Normal 68000 Cycle

	// There's also Figure 6-9, which in theory nails down slot usage, but
	// numbers the boundaries between slots rather than the slots themselves...
	// and has nine slots depicted between positions $20 and $21. So
	// whether the boundary numbers assign to the slots on their left or on
	// their right is entirely opaque.

	// I therefore take the word of Toni Wilen via https://eab.abime.net/showpost.php?p=938307&postcount=2
	// as definitive: "CPU ... generally ... uses even [cycles] only".
	//
	// So probably the Copper requests the bus only on _even_ cycles?


	// General rule:
	//
	//	Chipset work on odd cycles, 68000 access on even.
	//
	// Exceptions:
	//
	//	Bitplanes, the Blitter if a flag is set.

	if constexpr (cycle & 1) {
		// Odd slot use/priority:
		//
		//	1. Bitplane fetches [dealt with above].
		//	2. Refresh, disk, audio, sprites or Copper. Depending on region.
		//
		// Blitter and CPU priority is dealt with below.
		if constexpr (cycle >= 0x00 && cycle < 0x08) {
			// Memory refresh, four slots per line.
			return false;
		}

		if constexpr (cycle >= 0x08 && cycle < 0x0e) {
			constexpr auto DiskEnabled = DMAFlag::AllBelow | DMAFlag::Disk;
			if((dma_control_ & DiskEnabled) == DiskEnabled) {
				if(disk_.advance_dma()) {
					return false;
				}
			}
		}

		if constexpr (cycle >= 0xe && cycle < 0x16) {
			constexpr auto channel = (cycle - 0xe) >> 1;
			static_assert(channel >= 0 && channel < 4);
			static_assert(cycle != 0x15 || channel == 3);

			constexpr DMAFlag::FlagT AudioFlags[] = {
				DMAFlag::AllBelow | DMAFlag::AudioChannel0,
				DMAFlag::AllBelow | DMAFlag::AudioChannel1,
				DMAFlag::AllBelow | DMAFlag::AudioChannel2,
				DMAFlag::AllBelow | DMAFlag::AudioChannel3,
			};

			if((dma_control_ & AudioFlags[channel]) == AudioFlags[channel]) {
				if(audio_.advance_dma(channel)) {
					return false;
				}
			}
		}

		if constexpr (cycle >= 0x16 && cycle < 0x36) {
			constexpr auto SpritesEnabled = DMAFlag::AllBelow | DMAFlag::Sprites;
			if(y_ >= vertical_blank_height_ && (dma_control_ & SpritesEnabled) == SpritesEnabled) {
				constexpr auto sprite_id = (cycle - 0x16) >> 2;
				static_assert(sprite_id >= 0 && sprite_id < std::tuple_size<decltype(sprites_)>::value);

				if(sprites_[sprite_id].advance_dma((~cycle&2) >> 1, y_, y_ == vertical_blank_height_)) {
					return false;
				}
			}
		}
	} else {
		// Bitplanes having been dealt with, specific even-cycle responsibility
		// is just possibly to pass to the Copper.
		constexpr auto CopperEnabled = DMAFlag::AllBelow | DMAFlag::Copper;
		if((dma_control_ & CopperEnabled) == CopperEnabled) {
			if(copper_.advance_dma(uint16_t(((y_ & 0xff) << 8) | cycle), blitter_.get_status())) {
				return false;
			}
		} else {
			copper_.stop();
		}

		// Picking between the Blitter and CPU occurs below, if applicable.
		// But if the Blitter priority bit isn't set then don't even give it
		// a look-in — nothing else having claimed this slot, leave it vacant
		// for the CPU.
		if(!(dma_control_ & DMAFlag::BlitterPriority)) {
			return true;
		}
	}

	// Give first refusal to the Blitter (if enabled), otherwise pass on to the CPU.
	//
	// TODO: determine why I see Blitter issues if I don't allow it to complete immediately.
	// All tests pass without immediate completion, and immediate completion just runs the
	// non-immediate version until the busy flag is disabled. So probably a scheduling or
	// signalling issue out here.
	constexpr auto BlitterEnabled = DMAFlag::AllBelow | DMAFlag::Blitter;
	return (dma_control_ & BlitterEnabled) != BlitterEnabled || !blitter_.advance_dma<true>();
}